

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask13_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar7 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x4c443830241c1008));
  uVar1 = in[0x15];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[5] * 2)));
  auVar6 = auVar7._0_16_;
  auVar4 = vpsrlvd_avx2(auVar6,_DAT_00198ed0);
  auVar5 = vpsrlvd_avx2(auVar6,_DAT_00198ee0);
  auVar6 = vpinsrd_avx(auVar6,in[5] * 2,1);
  auVar6 = vpinsrd_avx(auVar6,in[10] << 2,3);
  auVar6 = vpor_avx(auVar6,auVar4);
  auVar3 = vpsllvd_avx2(auVar7,_DAT_00195920);
  auVar6 = vpblendd_avx2(auVar5,auVar6,10);
  vpmovsxbd_avx2(ZEXT816(0x4840342c20180c04));
  auVar8 = valignd_avx512vl(ZEXT1632(auVar6),ZEXT1632(auVar6),7);
  auVar9 = vpgatherdd_avx512vl(*in);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_001958e0);
  auVar8 = vpblendd_avx2(auVar8,ZEXT432(*in),1);
  auVar10 = vpbroadcastd_avx512vl();
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x20);
  auVar10 = vpbroadcastd_avx512vl();
  uVar2 = in[0x14];
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x40);
  auVar10 = vpbroadcastd_avx512vl();
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x80);
  auVar8 = vpternlogd_avx512vl(auVar3,auVar9,auVar8,0xfe);
  *(undefined1 (*) [32])out = auVar8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 0x16);
  auVar4 = vpsllvd_avx2(auVar6,_DAT_001a4240);
  auVar6 = vpinsrd_avx(ZEXT416(uVar1 << 0x11 | uVar2 << 4 | auVar7._28_4_ >> 9),
                       (uint)(*(ulong *)(in + 0x16) >> 2) & 0x3fffffff,1);
  auVar6 = vpor_avx(auVar4,auVar6);
  *(long *)(out + 8) = auVar6._0_8_;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask13_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (13 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (13 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (13 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (13 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (13 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (13 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (13 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (13 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (13 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;

  return out + 1;
}